

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O2

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::PartialPivLU
          (PartialPivLU<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *this,MatrixType *matrix)

{
  DenseIndex local_20;
  DenseIndex local_18;
  
  local_20 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.
             m_rows;
  local_18 = local_20;
  Matrix<float,-1,-1,0,4,4>::Matrix<long,long>
            ((Matrix<float,_1,_1,0,4,4> *)this,&local_18,&local_20);
  PermutationMatrix<-1,_4,_int>::PermutationMatrix
            (&this->m_p,
             (int)(matrix->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).m_storage.
                  m_rows);
  Transpositions<-1,_4,_int>::Transpositions
            (&this->m_rowsTranspositions,
             (Index)(matrix->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>).
                    m_storage.m_rows);
  this->m_det_p = 0;
  this->m_isInitialized = false;
  compute(this,matrix);
  return;
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const MatrixType& matrix)
  : m_lu(matrix.rows(), matrix.rows()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix);
}